

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamCorePDF.hpp
# Opt level: O0

double TasDREAM::
       getDensity<(TasDREAM::TypeDistribution)1,(TasDREAM::TypeSamplingForm)0,double,double>
                 (double x,double params,double params_1)

{
  double dVar1;
  initializer_list<double> __l;
  reference pvVar2;
  double dVar3;
  allocator<double> local_59;
  double local_58;
  double local_50;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> ParameterArray;
  double params_local_1;
  double params_local;
  double x_local;
  
  local_48 = &local_58;
  local_40 = 2;
  local_58 = params;
  local_50 = params_1;
  ParameterArray.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)params_1;
  std::allocator<double>::allocator(&local_59);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,__l,&local_59);
  std::allocator<double>::~allocator(&local_59);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_38,0);
  dVar3 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_38,0);
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_38,1);
  dVar3 = exp(((x - dVar3) * -0.5 * (x - dVar1)) / *pvVar2);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return dVar3;
}

Assistant:

double getDensity(double x, Params... params){
    std::vector<typename std::tuple_element<0, std::tuple<Params...>>::type> ParameterArray = {params...};
    if (form == regform){
        if (distribution == dist_gaussian){
            return std::exp(-0.5 * (x - ParameterArray[0]) * (x - ParameterArray[0]) / ParameterArray[1]);
        }else if (distribution == dist_exponential){
            return std::exp(-ParameterArray[1] * (x - ParameterArray[0]));
        }else if (distribution == dist_beta){
            return std::pow(x - ParameterArray[0], ParameterArray[2] - 1.0) * std::pow(ParameterArray[1] - x, ParameterArray[3] - 1.0);
        }else if (distribution == dist_gamma){
            return std::pow(x - ParameterArray[0], ParameterArray[1] - 1.0) * std::exp(- ParameterArray[2] * (x - ParameterArray[0]));
        }else{ // uniform
            return 1.0;
        }
    }else{
        if (distribution == dist_gaussian){
            return -0.5 * (x - ParameterArray[0]) * (x - ParameterArray[0]) / ParameterArray[1];
        }else if (distribution == dist_exponential){
            return -ParameterArray[1] * (x - ParameterArray[0]);
        }else if (distribution == dist_beta){
            return std::log(x - ParameterArray[0]) * (ParameterArray[2] - 1.0) + std::log(ParameterArray[1] - x) * (ParameterArray[3] - 1.0);
        }else if (distribution == dist_gamma){
            return std::log(x - ParameterArray[0]) * (ParameterArray[1] - 1.0) - ParameterArray[2] * (x - ParameterArray[0]);
        }else{ // uniform
            return 0.0;
        }
    }
}